

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3ExprCodeGetColumnOfTable(Vdbe *v,Table *pTab,int iTabCur,int iCol,int regOut)

{
  i16 iVar1;
  sqlite3_value *in_RAX;
  Index *pIdx;
  int p2;
  int op;
  bool bVar2;
  sqlite3_value *local_38;
  
  if (pTab == (Table *)0x0) {
    sqlite3VdbeAddOp3(v,0x60,iTabCur,iCol,regOut);
    return;
  }
  local_38 = in_RAX;
  if ((iCol < 0) || (pTab->iPKey == iCol)) {
    sqlite3VdbeAddOp2(v,0x7b,iTabCur,regOut);
    if (iCol < 0) {
      return;
    }
  }
  else {
    bVar2 = pTab->nModuleArg != 0;
    op = 0x60;
    if (bVar2) {
      op = 0x9d;
    }
    p2 = iCol;
    if ((pTab->tabFlags & 0x20) != 0 && !bVar2) {
      pIdx = sqlite3PrimaryKeyIndex(pTab);
      iVar1 = sqlite3ColumnOfIndex(pIdx,(i16)iCol);
      p2 = (int)iVar1;
    }
    sqlite3VdbeAddOp3(v,op,iTabCur,p2,regOut);
  }
  if (pTab->pSelect == (Select *)0x0) {
    local_38 = (sqlite3_value *)0x0;
    sqlite3ValueFromExpr
              (v->db,pTab->aCol[(uint)iCol].pDflt,v->db->enc,pTab->aCol[(uint)iCol].affinity,
               &local_38);
    if (local_38 != (sqlite3_value *)0x0) {
      sqlite3VdbeAppendP4(v,local_38,-0xb);
    }
  }
  if (pTab->aCol[(uint)iCol].affinity != 'E') {
    return;
  }
  sqlite3VdbeAddOp1(v,0x48,regOut);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprCodeGetColumnOfTable(
  Vdbe *v,        /* The VDBE under construction */
  Table *pTab,    /* The table containing the value */
  int iTabCur,    /* The table cursor.  Or the PK cursor for WITHOUT ROWID */
  int iCol,       /* Index of the column to extract */
  int regOut      /* Extract the value into this register */
){
  if( pTab==0 ){
    sqlite3VdbeAddOp3(v, OP_Column, iTabCur, iCol, regOut);
    return;
  }
  if( iCol<0 || iCol==pTab->iPKey ){
    sqlite3VdbeAddOp2(v, OP_Rowid, iTabCur, regOut);
  }else{
    int op = IsVirtual(pTab) ? OP_VColumn : OP_Column;
    int x = iCol;
    if( !HasRowid(pTab) && !IsVirtual(pTab) ){
      x = sqlite3ColumnOfIndex(sqlite3PrimaryKeyIndex(pTab), iCol);
    }
    sqlite3VdbeAddOp3(v, op, iTabCur, x, regOut);
  }
  if( iCol>=0 ){
    sqlite3ColumnDefault(v, pTab, iCol, regOut);
  }
}